

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void disturb(player *p)

{
  _Bool _Var1;
  player *p_local;
  
  cmd_cancel_repeat();
  _Var1 = player_is_resting(p);
  if (_Var1) {
    player_resting_cancel(p,true);
    p->upkeep->redraw = p->upkeep->redraw | 0x8000;
  }
  if (p->upkeep->running != L'\0') {
    p->upkeep->running = L'\0';
    mem_free(p->upkeep->steps);
    p->upkeep->steps = (int16_t *)0x0;
    cmdq_flush();
    event_signal(EVENT_PLAYERMOVED);
    p->upkeep->update = p->upkeep->update | 2;
    event_signal_point(EVENT_MAP,L'\xffffffff',L'\xffffffff');
  }
  event_signal(EVENT_INPUT_FLUSH);
  return;
}

Assistant:

void disturb(struct player *p)
{
	/* Cancel repeated commands */
	cmd_cancel_repeat();

	/* Cancel Resting */
	if (player_is_resting(p)) {
		player_resting_cancel(p, true);
		p->upkeep->redraw |= PR_STATE;
	}

	/* Cancel running */
	if (p->upkeep->running) {
		p->upkeep->running = 0;
		mem_free(p->upkeep->steps);
		p->upkeep->steps = NULL;

		/* Cancel queued commands */
		cmdq_flush();

		/* Check for new panel if appropriate */
		event_signal(EVENT_PLAYERMOVED);
		p->upkeep->update |= PU_TORCH;

		/* Mark the whole map to be redrawn */
		event_signal_point(EVENT_MAP, -1, -1);
	}

	/* Flush input */
	event_signal(EVENT_INPUT_FLUSH);
}